

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMTypeRef CompileLlvmFunctionType(LlvmCompilationContext *ctx,TypeFunction *functionType)

{
  TypeHandle *val;
  IntrusiveList<TypeHandle> *pIVar1;
  ArrayView<TypeBase_*> argumentTypes_00;
  SmallArray<TypeBase_*,_32U> argumentTypes;
  SmallArray<TypeBase_*,_32U> local_138;
  
  local_138.allocator = ctx->allocator;
  local_138.data = local_138.little;
  local_138.count = 0;
  local_138.max = 0x20;
  pIVar1 = &functionType->arguments;
  while (val = pIVar1->head, val != (TypeHandle *)0x0) {
    SmallArray<TypeBase_*,_32U>::push_back(&local_138,&val->type);
    pIVar1 = (IntrusiveList<TypeHandle> *)&val->next;
  }
  SmallArray<TypeBase_*,_32U>::push_back(&local_138,&ctx->ctx->typeNullPtr);
  argumentTypes_00.count = local_138.count;
  argumentTypes_00.data = local_138.data;
  argumentTypes_00._12_4_ = 0;
  CompileLlvmFunctionType(ctx,functionType->returnType,argumentTypes_00);
  SmallArray<TypeBase_*,_32U>::~SmallArray(&local_138);
  return (LLVMTypeRef)&placeholderType;
}

Assistant:

LLVMTypeRef CompileLlvmFunctionType(LlvmCompilationContext &ctx, TypeFunction *functionType)
{
	SmallArray<TypeBase*, 32> argumentTypes(ctx.allocator);

	for(TypeHandle *curr = functionType->arguments.head; curr; curr = curr->next)
		argumentTypes.push_back(curr->type);

	argumentTypes.push_back(ctx.ctx.typeNullPtr);

	return CompileLlvmFunctionType(ctx, functionType->returnType, argumentTypes);
}